

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 ImTriangleClosestPoint(ImVec2 *a,ImVec2 *b,ImVec2 *c,ImVec2 *p)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float local_48;
  float fStack_44;
  float local_38;
  float fStack_34;
  
  IVar1 = ImLineClosestPoint(a,b,p);
  IVar2 = ImLineClosestPoint(b,c,p);
  IVar3 = ImLineClosestPoint(c,a,p);
  fVar4 = IVar3.x;
  fVar5 = IVar3.y;
  local_48 = IVar1.x;
  fStack_44 = IVar1.y;
  fVar9 = p->x;
  fVar8 = p->y;
  fVar6 = (fVar9 - local_48) * (fVar9 - local_48) + (fVar8 - fStack_44) * (fVar8 - fStack_44);
  local_38 = IVar2.x;
  fStack_34 = IVar2.y;
  fVar7 = (fVar9 - local_38) * (fVar9 - local_38) + (fVar8 - fStack_34) * (fVar8 - fStack_34);
  fVar8 = (fVar9 - fVar4) * (fVar9 - fVar4) + (fVar8 - fVar5) * (fVar8 - fVar5);
  fVar9 = fVar7;
  if (fVar8 <= fVar7) {
    fVar9 = fVar8;
  }
  fVar8 = fVar6;
  if (fVar9 <= fVar6) {
    fVar8 = fVar9;
  }
  if ((fVar8 == fVar7) && (!NAN(fVar8) && !NAN(fVar7))) {
    fVar4 = local_38;
    fVar5 = fStack_34;
  }
  if ((fVar8 == fVar6) && (!NAN(fVar8) && !NAN(fVar6))) {
    fVar4 = local_48;
    fVar5 = fStack_44;
  }
  IVar1.y = fVar5;
  IVar1.x = fVar4;
  return IVar1;
}

Assistant:

ImVec2 ImTriangleClosestPoint(const ImVec2& a, const ImVec2& b, const ImVec2& c, const ImVec2& p)
{
    ImVec2 proj_ab = ImLineClosestPoint(a, b, p);
    ImVec2 proj_bc = ImLineClosestPoint(b, c, p);
    ImVec2 proj_ca = ImLineClosestPoint(c, a, p);
    float dist2_ab = ImLengthSqr(p - proj_ab);
    float dist2_bc = ImLengthSqr(p - proj_bc);
    float dist2_ca = ImLengthSqr(p - proj_ca);
    float m = ImMin(dist2_ab, ImMin(dist2_bc, dist2_ca));
    if (m == dist2_ab)
        return proj_ab;
    if (m == dist2_bc)
        return proj_bc;
    return proj_ca;
}